

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcList_item *p)

{
  int iVar1;
  Table *pTVar2;
  char *pcStack_28;
  int iDb;
  char *zDb;
  SrcList_item *p_local;
  u32 flags_local;
  Parse *pParse_local;
  
  if (p->pSchema == (Schema *)0x0) {
    pcStack_28 = p->zDatabase;
  }
  else {
    iVar1 = sqlite3SchemaToIndex(pParse->db,p->pSchema);
    pcStack_28 = pParse->db->aDb[iVar1].zDbSName;
  }
  pTVar2 = sqlite3LocateTable(pParse,flags,p->zName,pcStack_28);
  return pTVar2;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse, 
  u32 flags,
  struct SrcList_item *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}